

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O2

set<Addr,_std::less<Addr>,_std::allocator<Addr>_> * __thiscall
BpTree<int>::FindLess
          (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *__return_storage_ptr__,
          BpTree<int> *this,int k,bool EQ)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  IndexNode<int> C;
  IndexNode<int> local_f0;
  IndexNode<int> local_90;
  
  IndexNode<int>::IndexNode(&local_f0,this->N);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if ((this->RootAddr).FileOff != -1) {
    FindNode(this,this->RootAddr,&local_f0);
    while( true ) {
      IndexNode<int>::IndexNode(&local_90,&local_f0);
      cVar2 = local_90.NodeState;
      IndexNode<int>::~IndexNode(&local_90);
      if (cVar2 == '1') break;
      FindNode(this,*local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_f0);
    }
    while( true ) {
      do {
        lVar5 = 0;
        uVar6 = 0;
        if (EQ) {
          for (; ((lVar4 = (long)this->N + -1, (long)uVar6 < lVar4 &&
                  (local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar6] == '1')) &&
                 (local_f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar6] <= k)); uVar6 = uVar6 + 1) {
            std::_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>::
            _M_insert_unique<Addr_const&>
                      ((_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>
                        *)__return_storage_ptr__,
                       (Addr *)((long)&(local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->BlockNum + lVar5)
                      );
            lVar5 = lVar5 + 8;
          }
          if (k < local_f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar6]) goto LAB_00129c49;
        }
        else {
          for (; ((lVar4 = (long)this->N + -1, (long)uVar6 < lVar4 &&
                  (local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar6] == '1')) &&
                 (local_f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar6] < k)); uVar6 = uVar6 + 1) {
            std::_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>::
            _M_insert_unique<Addr_const&>
                      ((_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>
                        *)__return_storage_ptr__,
                       (Addr *)((long)&(local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->BlockNum + lVar5)
                      );
            lVar5 = lVar5 + 8;
          }
          if (k <= local_f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar6]) goto LAB_00129c49;
        }
        iVar3 = (int)lVar4;
      } while ((iVar3 != (int)uVar6) &&
              (local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start[uVar6 & 0xffffffff] != '0'));
      if (local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data
          ._M_start[iVar3].FileOff == -1) break;
      if ((iVar3 == (int)uVar6) ||
         (local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
          ._M_start[uVar6 & 0xffffffff] == '0')) {
        FindNode(this,local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar3],&local_f0);
      }
    }
  }
LAB_00129c49:
  IndexNode<int>::~IndexNode(&local_f0);
  return __return_storage_ptr__;
}

Assistant:

set<Addr> BpTree<K>::FindLess(K k, bool EQ) {
	IndexNode<K> C(N);
	set<Addr> ret;
	int i, pos = 0;
	if (this->RootAddr.FileOff == -1)
		return ret;
	this->FindNode(this->RootAddr, C);
	while (!this->IsLeaf(C)) {
		this->FindNode(C.p[0], C);
	}
	while (1) {
		if (EQ == false) {
			for (i = pos; i < N - 1 && C.v[i] == '1' && C.k[i] < k; i++) {
				ret.insert(C.p[i]);
			}
			if (C.k[i] >= k) {
				break;
			}
		}
		else {
			for (i = pos; i < N - 1 && C.v[i] == '1' && C.k[i] <= k; i++) {
				ret.insert(C.p[i]);
			}
			if (C.k[i] > k) {
				break;
			}
		}
		if ((i == N - 1 || C.v[i] == '0') && C.p[N - 1].FileOff == -1) {
			break;
		}
		else if (i == N - 1 || C.v[i] == '0') {
			pos = 0;
			this->FindNode(C.p[N - 1], C);
		}
	}
	return ret;
}